

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall cfd::core::HDWallet::HDWallet(HDWallet *this,ByteData *seed)

{
  size_t sVar1;
  string *message;
  undefined8 uVar2;
  ByteData *in_stack_ffffffffffffff78;
  ByteData *in_stack_ffffffffffffff80;
  CfdError error_code;
  allocator local_49;
  string local_48 [48];
  ByteData *local_18;
  ByteData *seed_local;
  HDWallet *this_local;
  
  local_18 = seed;
  seed_local = &this->seed_;
  ByteData::ByteData(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  sVar1 = ByteData::GetDataSize(local_18);
  if (sVar1 != 0x10) {
    sVar1 = ByteData::GetDataSize(local_18);
    if (sVar1 != 0x20) {
      message = (string *)ByteData::GetDataSize(local_18);
      error_code = (CfdError)(sVar1 >> 0x20);
      if (message != (string *)0x40) {
        uVar2 = __cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_48,"Seed length error.",&local_49);
        CfdException::CfdException((CfdException *)this,error_code,message);
        __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  return;
}

Assistant:

HDWallet::HDWallet(const ByteData& seed) : seed_(seed) {
  if ((seed.GetDataSize() != HDWallet::kSeed128Size) &&
      (seed.GetDataSize() != HDWallet::kSeed256Size) &&
      (seed.GetDataSize() != HDWallet::kSeed512Size)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Seed length error.");
  }
}